

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

void __thiscall SignalSwitcher::~SignalSwitcher(SignalSwitcher *this)

{
  if ((this->is_active == true) && (handle_is_locked)) {
    interrupt_switch = false;
    restore_handle(this);
    return;
  }
  if ((this->is_active == true) && (handle_is_locked)) {
    signal(2,(__sighandler_t)this->old_sig);
    this->is_active = false;
    handle_is_locked = false;
  }
  return;
}

Assistant:

SignalSwitcher::~SignalSwitcher()
{
    #ifndef _FOR_PYTHON
    #pragma omp critical
    {
        if (this->is_active && handle_is_locked)
            interrupt_switch = false;
    }
    #endif
    this->restore_handle();
}